

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_3.h
# Opt level: O0

void __thiscall
PlayerMike_3::fillPredict(PlayerMike_3 *this,vector<Move,_std::allocator<Move>_> *moveHistory)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  vector<Move,_std::allocator<Move>_> *in_RSI;
  long in_RDI;
  int ix_1;
  size_t i;
  int ix;
  ulong local_20;
  int local_14;
  
  for (local_14 = 0; local_14 < 0x1b; local_14 = local_14 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)local_14);
    *pvVar3 = 0;
  }
  local_20 = 1;
  while( true ) {
    sVar4 = std::vector<Move,_std::allocator<Move>_>::size(in_RSI);
    if (sVar4 <= local_20) break;
    pvVar5 = std::vector<Move,_std::allocator<Move>_>::operator[](in_RSI,local_20 - 1);
    iVar1 = pvVar5->m_you;
    pvVar5 = std::vector<Move,_std::allocator<Move>_>::operator[](in_RSI,local_20 - 1);
    iVar2 = pvVar5->m_me;
    pvVar5 = std::vector<Move,_std::allocator<Move>_>::operator[](in_RSI,local_20);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),
                        (long)(iVar1 * 9 + iVar2 * 3 + pvVar5->m_you));
    *pvVar3 = *pvVar3 + 1;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void fillPredict(const std::vector<Move>& moveHistory)
   {
      for (int ix=0; ix<27; ++ix)
      {
         m_predict[ix] = 0;
      }

      for (size_t i=1; i<moveHistory.size(); ++i)
      {
         int ix = moveHistory[i-1].m_you*9 + moveHistory[i-1].m_me*3 + moveHistory[i].m_you;
         m_predict[ix] += 1;
      }

#ifdef DEBUG
      for (int row=0; row<9; ++row)
      {
         std::cout << m_predict[3*row] << " , " << m_predict[3*row+1] << " , " << m_predict[3*row+2] << std::endl;
      }
#endif
   }